

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O0

bool __thiscall OpenMD::SelectionCompiler::compileExpression(SelectionCompiler *this,int itoken)

{
  bool bVar1;
  size_type sVar2;
  int in_ESI;
  SelectionCompiler *in_RDI;
  SelectionCompiler *in_stack_00000008;
  int i;
  SelectionCompiler *in_stack_00000020;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_stack_00000078;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_stack_00000080;
  Token *in_stack_ffffffffffffffd8;
  size_type sVar3;
  int local_18;
  bool local_1;
  
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::clear
            ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)0x37dfd3);
  for (local_18 = 0; local_18 < in_ESI; local_18 = local_18 + 1) {
    std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[]
              (&in_RDI->atokenCommand,(long)local_18);
    addTokenToPostfix(in_RDI,in_stack_ffffffffffffffd8);
  }
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=
            (in_stack_00000080,in_stack_00000078);
  in_RDI->itokenInfix = (long)in_ESI;
  addTokenToPostfix(in_RDI,in_stack_ffffffffffffffd8);
  bVar1 = clauseOr(in_stack_00000008);
  if (bVar1) {
    addTokenToPostfix(in_RDI,in_stack_ffffffffffffffd8);
    sVar3 = in_RDI->itokenInfix;
    sVar2 = std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::size(&in_RDI->atokenInfix);
    if (sVar3 == sVar2) {
      std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator=
                (in_stack_00000080,in_stack_00000078);
      local_1 = true;
    }
    else {
      local_1 = endOfExpressionExpected(in_stack_00000020);
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool SelectionCompiler::compileExpression(int itoken) {
    ltokenPostfix.clear();
    for (int i = 0; i < itoken; ++i) {
      addTokenToPostfix(atokenCommand[i]);
    }

    atokenInfix = atokenCommand;
    itokenInfix = itoken;

    addTokenToPostfix(Token::tokenExpressionBegin);
    if (!clauseOr()) { return false; }

    addTokenToPostfix(Token::tokenExpressionEnd);
    if (itokenInfix != atokenInfix.size()) { return endOfExpressionExpected(); }

    atokenCommand = ltokenPostfix;
    return true;
  }